

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd.c
# Opt level: O0

int get_token_from_fp(FILE *fp,char *buff,char d)

{
  int iVar1;
  char in_DL;
  undefined1 *in_RSI;
  FILE *in_RDI;
  bool bVar2;
  int i;
  char c;
  int local_20;
  char local_1a;
  
  *in_RSI = 0;
  iVar1 = feof(in_RDI);
  if (iVar1 == 0) {
    iVar1 = fgetc(in_RDI);
    local_1a = (char)iVar1;
    if (local_1a == in_DL) {
      *in_RSI = 0;
    }
    else {
      while( true ) {
        bVar2 = true;
        if ((local_1a != '\n') && (bVar2 = true, local_1a != '\r')) {
          bVar2 = local_1a == '\t';
        }
        if (!bVar2) {
          local_20 = 0;
          while( true ) {
            bVar2 = false;
            if ((((local_1a != in_DL) && (bVar2 = false, local_1a != '\n')) &&
                (bVar2 = false, local_1a != '\r')) && (bVar2 = false, local_1a != '\t')) {
              iVar1 = feof(in_RDI);
              bVar2 = iVar1 == 0;
            }
            if (!bVar2) break;
            in_RSI[local_20] = local_1a;
            iVar1 = fgetc(in_RDI);
            local_1a = (char)iVar1;
            local_20 = local_20 + 1;
          }
          in_RSI[local_20] = 0;
          return local_20;
        }
        iVar1 = feof(in_RDI);
        if (iVar1 != 0) break;
        iVar1 = getc(in_RDI);
        local_1a = (char)iVar1;
      }
    }
  }
  return 0;
}

Assistant:

static int get_token_from_fp(FILE * fp, char *buff, char d)
{
   char c;
   int i;

   buff[0] = '\0';

   if (feof(fp))
      return 0;
   c = fgetc(fp);
   if (c == d) {
      buff[0] = '\0';
      return 0;
   }

   while (c == '\n' || c == '\r' || c == '\t') {
      if (feof(fp))
         return 0;
      c = getc(fp);
   }

   for (i = 0; c != d && c != '\n' && c != '\r' && c != '\t' && !feof(fp); i++) {
      buff[i] = c;
      c = fgetc(fp);
   }

   buff[i] = '\0';
   return i;
}